

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS ref_geom_bary3(REF_GEOM ref_geom,REF_INT *nodes,REF_DBL *uv,REF_DBL *bary)

{
  REF_INT id;
  undefined1 auVar1 [16];
  uint uVar2;
  undefined8 uVar3;
  char *pcVar4;
  double dVar5;
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  REF_INT sens;
  REF_INT geom2;
  REF_INT geom1;
  REF_INT geom0;
  REF_DBL uv2 [2];
  REF_DBL uv1 [2];
  REF_DBL uv0 [2];
  REF_INT local_80;
  int local_7c;
  int local_78;
  int local_74;
  REF_INT *local_70;
  double local_68;
  double local_60;
  REF_DBL local_58;
  REF_DBL local_50;
  REF_DBL local_48;
  REF_DBL local_40;
  
  uVar2 = ref_geom_cell_tuv(ref_geom,*nodes,nodes,2,&local_48,&local_80);
  if (uVar2 == 0) {
    uVar2 = ref_geom_cell_tuv(ref_geom,nodes[1],nodes,2,&local_58,&local_80);
    if (uVar2 == 0) {
      uVar2 = ref_geom_cell_tuv(ref_geom,nodes[2],nodes,2,&local_68,&local_80);
      if (uVar2 == 0) {
        id = nodes[3];
        uVar2 = ref_geom_find(ref_geom,*nodes,2,id,&local_74);
        if (uVar2 == 0) {
          local_70 = ref_geom->descr;
          if (local_70[(long)local_74 * 6 + 4] != 0) {
            if (local_70[(long)local_74 * 6 + 4] < 1) {
              local_48 = *uv;
            }
            else {
              local_40 = uv[1];
            }
          }
          uVar2 = ref_geom_find(ref_geom,nodes[1],2,id,&local_78);
          if (uVar2 == 0) {
            if (local_70[(long)local_78 * 6 + 4] != 0) {
              if (local_70[(long)local_78 * 6 + 4] < 1) {
                local_58 = *uv;
              }
              else {
                local_50 = uv[1];
              }
            }
            uVar2 = ref_geom_find(ref_geom,nodes[2],2,id,&local_7c);
            if (uVar2 == 0) {
              if (local_70[(long)local_7c * 6 + 4] != 0) {
                if (local_70[(long)local_7c * 6 + 4] < 1) {
                  local_68 = *uv;
                }
                else {
                  local_60 = uv[1];
                }
              }
              auVar6._0_8_ = local_58 * local_60 +
                             (((*uv * local_50 + (uv[1] * local_68 - local_58 * uv[1])) -
                              local_68 * local_50) - *uv * local_60);
              *bary = auVar6._0_8_;
              dVar7 = *uv * local_60 +
                      (((local_48 * uv[1] + (local_68 * local_40 - *uv * local_40)) -
                       local_68 * uv[1]) - local_48 * local_60);
              bary[1] = dVar7;
              dVar8 = local_58 * uv[1] +
                      (((local_48 * local_50 + (local_40 * *uv - local_58 * local_40)) -
                       *uv * local_50) - local_48 * uv[1]);
              bary[2] = dVar8;
              dVar5 = auVar6._0_8_ + dVar7 + dVar8;
              auVar10._0_8_ = dVar5 * 1e+20;
              auVar10._8_8_ = auVar6._0_8_;
              auVar11._8_8_ = -auVar6._0_8_;
              auVar11._0_8_ = -auVar10._0_8_;
              auVar11 = maxpd(auVar10,auVar11);
              dVar9 = auVar11._0_8_;
              if (auVar11._8_8_ < dVar9) {
                dVar12 = dVar7;
                if (dVar7 <= -dVar7) {
                  dVar12 = -dVar7;
                }
                if (dVar12 < dVar9) {
                  dVar12 = dVar8;
                  if (dVar8 <= -dVar8) {
                    dVar12 = -dVar8;
                  }
                  if (dVar12 < dVar9) {
                    auVar6._8_8_ = dVar7;
                    auVar1._8_8_ = dVar5;
                    auVar1._0_8_ = dVar5;
                    auVar11 = divpd(auVar6,auVar1);
                    *(undefined1 (*) [16])bary = auVar11;
                    bary[2] = dVar8 / dVar5;
                    return 0;
                  }
                }
              }
              printf("%s: %d: %s: div zero total %.18e norms %.18e %.18e %.18e\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0xf4f,"ref_geom_bary3");
              *bary = 0.0;
              bary[1] = 0.0;
              bary[2] = 0.0;
              return 4;
            }
            pcVar4 = "g2";
            uVar3 = 0xf34;
          }
          else {
            pcVar4 = "g1";
            uVar3 = 0xf2b;
          }
        }
        else {
          pcVar4 = "g0";
          uVar3 = 0xf22;
        }
      }
      else {
        pcVar4 = "uv2";
        uVar3 = 0xf20;
      }
    }
    else {
      pcVar4 = "uv1";
      uVar3 = 0xf1e;
    }
  }
  else {
    pcVar4 = "uv0";
    uVar3 = 0xf1c;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar3,
         "ref_geom_bary3",(ulong)uVar2,pcVar4);
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_geom_bary3(REF_GEOM ref_geom, REF_INT *nodes,
                                  REF_DBL *uv, REF_DBL *bary) {
  REF_DBL uv0[2], uv1[2], uv2[2];
  REF_INT sens;
  REF_DBL total;
  REF_INT geom0, geom1, geom2;
  RSS(ref_geom_cell_tuv(ref_geom, nodes[0], nodes, REF_GEOM_FACE, uv0, &sens),
      "uv0");
  RSS(ref_geom_cell_tuv(ref_geom, nodes[1], nodes, REF_GEOM_FACE, uv1, &sens),
      "uv1");
  RSS(ref_geom_cell_tuv(ref_geom, nodes[2], nodes, REF_GEOM_FACE, uv2, &sens),
      "uv2");

  RSS(ref_geom_find(ref_geom, nodes[0], REF_GEOM_FACE, nodes[3], &geom0), "g0");
  if (0 != ref_geom_degen(ref_geom, geom0)) {
    if (0 < ref_geom_degen(ref_geom, geom0)) {
      uv0[1] = uv[1];
    } else {
      uv0[0] = uv[0];
    }
  }

  RSS(ref_geom_find(ref_geom, nodes[1], REF_GEOM_FACE, nodes[3], &geom1), "g1");
  if (0 != ref_geom_degen(ref_geom, geom1)) {
    if (0 < ref_geom_degen(ref_geom, geom1)) {
      uv1[1] = uv[1];
    } else {
      uv1[0] = uv[0];
    }
  }

  RSS(ref_geom_find(ref_geom, nodes[2], REF_GEOM_FACE, nodes[3], &geom2), "g2");
  if (0 != ref_geom_degen(ref_geom, geom2)) {
    if (0 < ref_geom_degen(ref_geom, geom2)) {
      uv2[1] = uv[1];
    } else {
      uv2[0] = uv[0];
    }
  }

  bary[0] = -uv1[0] * uv[1] + uv2[0] * uv[1] + uv[0] * uv1[1] -
            uv2[0] * uv1[1] - uv[0] * uv2[1] + uv1[0] * uv2[1];
  bary[1] = -uv[0] * uv0[1] + uv2[0] * uv0[1] + uv0[0] * uv[1] -
            uv2[0] * uv[1] - uv0[0] * uv2[1] + uv[0] * uv2[1];
  bary[2] = -uv1[0] * uv0[1] + uv[0] * uv0[1] + uv0[0] * uv1[1] -
            uv[0] * uv1[1] - uv0[0] * uv[1] + uv1[0] * uv[1];

  total = bary[0] + bary[1] + bary[2];

  if (ref_math_divisible(bary[0], total) &&
      ref_math_divisible(bary[1], total) &&
      ref_math_divisible(bary[2], total)) {
    bary[0] /= total;
    bary[1] /= total;
    bary[2] /= total;
  } else {
    REF_INT i;
    printf("%s: %d: %s: div zero total %.18e norms %.18e %.18e %.18e\n",
           __FILE__, __LINE__, __func__, total, bary[0], bary[1], bary[2]);
    for (i = 0; i < 3; i++) bary[i] = 0.0;
    return REF_DIV_ZERO;
  }

  return REF_SUCCESS;
}